

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

int bn2binpad(BIGNUM *a,uchar *to,int tolen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = a->top;
  if ((long)iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar3 = (iVar1 + -1) * 0x40;
    iVar1 = BN_num_bits_word(a->d[(long)iVar1 + -1]);
    iVar2 = iVar1 + iVar3 + 7;
    iVar1 = iVar1 + iVar3 + 0xe;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    iVar1 = iVar1 >> 3;
  }
  iVar2 = iVar1;
  if (tolen != -1) {
    iVar3 = tolen - iVar1;
    if (tolen < iVar1) {
      return -1;
    }
    iVar2 = tolen;
    if (iVar3 != 0 && iVar1 <= tolen) {
      memset(to,0,(long)iVar3);
      to = to + iVar3;
    }
  }
  while (iVar1 != 0) {
    iVar3 = iVar1 + -1;
    iVar1 = iVar1 + 6;
    if (-1 < iVar3) {
      iVar1 = iVar3;
    }
    *to = (uchar)(a->d[iVar1 >> 3] >> (((char)iVar3 - ((byte)iVar1 & 0xf8)) * '\b' & 0x3f));
    to = to + 1;
    iVar1 = iVar3;
  }
  return iVar2;
}

Assistant:

static int bn2binpad(const BIGNUM *a, unsigned char *to, int tolen)
{
    int i;
    BN_ULONG l;

    bn_check_top(a);
    i = BN_num_bytes(a);
    if (tolen == -1)
        tolen = i;
    else if (tolen < i)
        return -1;
    /* Add leading zeroes if necessary */
    if (tolen > i) {
        memset(to, 0, tolen - i);
        to += tolen - i;
    }
    while (i--) {
        l = a->d[i / BN_BYTES];
        *(to++) = (unsigned char)(l >> (8 * (i % BN_BYTES))) & 0xff;
    }
    return tolen;
}